

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O3

void __thiscall
Salsa20Cipher::processBytes(Salsa20Cipher *this,uint8_t *in,uint8_t *out,size_t byteCount)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t keyStream [64];
  byte local_68 [64];
  
  if (byteCount != 0) {
    do {
      generateKeyStream(this,local_68);
      uVar1 = 0x40;
      if (byteCount < 0x40) {
        uVar1 = byteCount;
      }
      uVar2 = 0;
      do {
        out[uVar2] = in[uVar2] ^ local_68[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      in = in + uVar2;
      out = out + uVar2;
      byteCount = byteCount - uVar1;
    } while (byteCount != 0);
  }
  return;
}

Assistant:

void processBytes(const uint8_t* in, uint8_t* out, size_t byteCount)
	{
		uint8_t keyStream[BLOCK_SIZE];

		while (byteCount != 0) {
			generateKeyStream(keyStream);

			const auto count = byteCount < BLOCK_SIZE ? byteCount : BLOCK_SIZE;
			for (auto i = 0u; i < count; ++i, --byteCount)
				*out++ = keyStream[i] ^ *in++;
		}
	}